

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_subq_32_ix(void)

{
  uint addr_in;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = m68ki_cpu.ir >> 9;
  addr_in = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_32(uVar1 & m68ki_cpu.address_mask);
  uVar3 = (-uVar3 | 0xfffffff8) + uVar2;
  m68ki_cpu.n_flag = uVar3 >> 0x18;
  m68ki_cpu.x_flag = (~uVar2 & uVar3) >> 0x17;
  m68ki_cpu.v_flag = (~uVar3 & uVar2) >> 0x18;
  m68ki_cpu.not_z_flag = uVar3;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,uVar3);
  return;
}

Assistant:

static void m68k_op_subq_32_ix(void)
{
	uint src = (((REG_IR >> 9) - 1) & 7) + 1;
	uint ea = EA_AY_IX_32();
	uint dst = m68ki_read_32(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, dst, res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);

	m68ki_write_32(ea, FLAG_Z);
}